

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<float> __thiscall
vkt::shaderexecutor::Functions::Distance<1>::doExpand
          (Distance<1> *this,ExpandContext *param_1,ArgExprs *args)

{
  ExprP<float> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  ExprP<float> EVar1;
  ExprP<float> local_38;
  ArgExprs *args_local;
  ExpandContext *param_1_local;
  Distance<1> *this_local;
  
  args_local = args;
  param_1_local = param_1;
  this_local = this;
  shaderexecutor::operator-((shaderexecutor *)&local_38,in_RCX,in_RCX + 1);
  length<1>((Functions *)this,&local_38);
  ExprP<float>::~ExprP(&local_38);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state =
       extraout_RDX;
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr =
       (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>;
}

Assistant:

ExprP<Ret>	doExpand	(ExpandContext&, const ArgExprs& args) const
	{
		return length<Size>(args.a - args.b);
	}